

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

vector<EvaluationState,_std::allocator<EvaluationState>_> * __thiscall
PDA::eclose(vector<EvaluationState,_std::allocator<EvaluationState>_> *__return_storage_ptr__,
           PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations)

{
  State *pSVar1;
  pointer pcVar2;
  Transition *pTVar3;
  pointer ppTVar4;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *pvVar5;
  size_t sVar6;
  char input;
  _Elt_pointer pbVar7;
  pointer ppTVar8;
  size_t *__x;
  pointer pEVar9;
  ulong uVar10;
  vector<EvaluationState,_std::allocator<EvaluationState>_> newEvaluations;
  EvaluationState evaluation;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  EvaluationState state;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_1d8;
  vector<Transition_*,_std::allocator<Transition_*>_> local_1c0;
  string local_1a8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_188;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *local_168;
  PDA *local_160;
  pointer local_158;
  pointer local_150;
  EvaluationState local_148;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_f0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  EvaluationState local_88;
  
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar9 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_158 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  local_168 = __return_storage_ptr__;
  local_160 = this;
  if (pEVar9 != local_158) {
    do {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_148,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pEVar9);
      pSVar1 = pEVar9->currentStates;
      local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148.currentStates = pSVar1;
      input = getEPSILON();
      pbVar7 = local_148.stack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_148.stack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_148.stack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar7 = local_148.stack.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pcVar2 = pbVar7[-1]._M_dataplus._M_p;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,pcVar2,pcVar2 + pbVar7[-1]._M_string_length);
      State::getTransitionsOnInput(&local_1c0,pSVar1,input,&local_1a8);
      ppTVar8 = local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_150 = pEVar9;
      ppTVar4 = local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        ppTVar8 = local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppTVar4 = local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      for (; ppTVar8 != ppTVar4; ppTVar8 = ppTVar8 + 1) {
        pTVar3 = *ppTVar8;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_d8,
                (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_148);
        uVar10 = (ulong)((long)(pTVar3->stackPush).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar3->stackPush).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
        while( true ) {
          uVar10 = uVar10 - 1;
          if ((int)(uint)uVar10 < 0) break;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_d8,
                      (pTVar3->stackPush).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + ((uint)uVar10 & 0x7fffffff));
        }
        pSVar1 = pTVar3->stateTo;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88,&local_d8);
        local_88.currentStates = pSVar1;
        std::vector<EvaluationState,_std::allocator<EvaluationState>_>::
        emplace_back<EvaluationState>(&local_1d8,&local_88);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_d8);
      }
      if (local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c0.
                              super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.
                              super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pEVar9 = local_150;
      if (local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector(&local_f0,&local_1d8)
        ;
        eclose((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_d8,local_160,
               &local_f0);
        std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_f0);
        sVar6 = local_d8.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
        for (__x = (size_t *)
                   local_d8.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map; __x != (size_t *)sVar6; __x = __x + 0xb)
        {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88,
                  (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__x);
          local_88.currentStates =
               (State *)(((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(__x + 10))->
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_map;
          std::vector<EvaluationState,std::allocator<EvaluationState>>::
          emplace_back<EvaluationState&>
                    ((vector<EvaluationState,std::allocator<EvaluationState>> *)&local_188,&local_88
                    );
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88);
        }
        std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                  ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_d8);
      }
      std::vector<EvaluationState,std::allocator<EvaluationState>>::emplace_back<EvaluationState&>
                ((vector<EvaluationState,std::allocator<EvaluationState>> *)&local_188,&local_148);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_1d8);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_148);
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != local_158);
  }
  pvVar5 = local_168;
  (local_168->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_168->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_168->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_188);
  return pvVar5;
}

Assistant:

std::vector<EvaluationState> PDA::eclose(std::vector<EvaluationState> evaluations) {
    bool addedSomething = false;
    std::vector<EvaluationState> newEvaluations;
    for (EvaluationState evaluation: evaluations) {
        std::vector<EvaluationState> recentEvaluations = {};
        for (Transition *transition: evaluation.currentStates->getTransitionsOnInput(getEPSILON(), evaluation.stack.top())) {
            std::stack<std::string> newStack = evaluation.stack;
            for (int j = transition->getStackPush().size() - 1; j >= 0; --j) {
//                if (transition->getStackPush()[j] != "e") { // e is epsilon, so nothing has to be pushed then
                    newStack.push(transition->getStackPush()[j]);
//                }
            }
            recentEvaluations.emplace_back(EvaluationState(newStack, transition->getStateTo()));
        }

        if (recentEvaluations.size() > 0) {
            for (EvaluationState state: eclose(recentEvaluations)) {
                newEvaluations.emplace_back(state);
            }
        }
        newEvaluations.emplace_back(evaluation);
    }
    if (!addedSomething) {
        return newEvaluations;
    }

    return eclose(newEvaluations);
}